

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddAllocatedSlowWithCopy<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this,Type *value,Arena *value_arena,Arena *my_arena)

{
  Type *new_value;
  Arena *my_arena_local;
  Arena *value_arena_local;
  Type *value_local;
  RepeatedPtrFieldBase *this_local;
  
  value_arena_local = (Arena *)value;
  if ((my_arena == (Arena *)0x0) || (value_arena != (Arena *)0x0)) {
    if (my_arena != value_arena) {
      value_arena_local = (Arena *)StringTypeHandler::NewFromPrototype(value,my_arena);
      StringTypeHandler::Merge(value,(string *)value_arena_local);
      StringTypeHandler::Delete(value,value_arena);
    }
  }
  else {
    Arena::Own<std::__cxx11::string>(my_arena,value);
  }
  UnsafeArenaAddAllocated<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (this,(Type *)value_arena_local);
  return;
}

Assistant:

void RepeatedPtrFieldBase::AddAllocatedSlowWithCopy(
    // Pass value_arena and my_arena to avoid duplicate virtual call (value) or
    // load (mine).
    typename TypeHandler::Type* value, Arena* value_arena, Arena* my_arena) {
  // Ensure that either the value is in the same arena, or if not, we do the
  // appropriate thing: Own() it (if it's on heap and we're in an arena) or copy
  // it to our arena/heap (otherwise).
  if (my_arena != NULL && value_arena == NULL) {
    my_arena->Own(value);
  } else if (my_arena != value_arena) {
    typename TypeHandler::Type* new_value =
        TypeHandler::NewFromPrototype(value, my_arena);
    TypeHandler::Merge(*value, new_value);
    TypeHandler::Delete(value, value_arena);
    value = new_value;
  }

  UnsafeArenaAddAllocated<TypeHandler>(value);
}